

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint max;
  JSValue v;
  JSValue JVar2;
  int end;
  int start;
  
  v = JS_ToStringCheckObject(ctx,this_val);
  JVar2 = v;
  if ((int)v.tag != 6) {
    max = *(uint *)((long)v.u.ptr + 4) & 0x7fffffff;
    iVar1 = JS_ToInt32Clamp(ctx,&start,*argv,0,max,max);
    if ((iVar1 == 0) &&
       ((end = max, (int)argv[1].tag == 3 ||
        (JVar2.tag = argv[1].tag, JVar2.u.ptr = argv[1].u.ptr,
        iVar1 = JS_ToInt32Clamp(ctx,&end,JVar2,0,max,max), iVar1 == 0)))) {
      iVar1 = end;
      if (end <= start) {
        iVar1 = start;
      }
      JVar2 = js_sub_string(ctx,(JSString *)v.u.ptr,start,iVar1);
    }
    else {
      JVar2 = (JSValue)(ZEXT816(6) << 0x40);
    }
    JS_FreeValue(ctx,v);
  }
  return JVar2;
}

Assistant:

static JSValue js_string_slice(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int len, start, end;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    end = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &end, argv[1], 0, len, len)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    ret = js_sub_string(ctx, p, start, max_int(end, start));
    JS_FreeValue(ctx, str);
    return ret;
}